

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApertureILS.cpp
# Opt level: O3

double __thiscall
imrt::ApertureILS::aLocalSearch(ApertureILS *this,Plan *P,double max_time,bool verbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int beamlet;
  uint beamlet_00;
  Plan *pPVar4;
  double dVar5;
  undefined1 auVar6 [8];
  char cVar7;
  ostream *poVar8;
  _Base_ptr *pp_Var9;
  clock_t cVar10;
  Plan *pPVar11;
  bool bVar12;
  _List_node_base *p_Var13;
  long lVar14;
  Station *this_00;
  Station *station;
  char *pcVar15;
  undefined1 auVar16 [8];
  int iVar17;
  long lVar18;
  Station *pSVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  double local_d0;
  uint local_c4;
  int local_ac;
  double local_a0;
  int local_94;
  undefined1 local_90 [16];
  _Base_ptr local_80;
  undefined1 local_78 [8];
  Plan *pPStack_70;
  _Base_ptr local_68 [2];
  _Base_ptr local_58;
  _Base_ptr local_50;
  Station *local_48;
  _List_node_base *local_40;
  Station *local_38;
  
  iVar1 = this->ls_type;
  local_90._0_8_ = local_90;
  local_80 = (_Base_ptr)0x0;
  this_00 = (Station *)P;
  local_90._8_8_ = local_90._0_8_;
  local_50 = (_Base_ptr)max_time;
  local_d0 = Plan::getEvaluation(P);
  if (verbose) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Staring aperture local search...",0x20);
    cVar7 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
    this_00 = (Station *)(ulong)(uint)(int)cVar7;
    std::ostream::put(-0x60);
    std::ostream::flush();
  }
  local_58 = (_Base_ptr)clock();
  local_ac = -1;
  local_94 = -1;
  auVar16 = (undefined1  [8])(Plan *)0x0;
  do {
    getShuffledApertureNeighbors
              ((vector<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>,_std::allocator<std::pair<std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                *)local_78,(ApertureILS *)this_00,P);
    pPVar4 = pPStack_70;
    auVar6 = local_78;
    local_78 = (undefined1  [8])0x0;
    pPStack_70 = (Plan *)0x0;
    local_68[0] = (_Base_ptr)0x0;
    if ((auVar16 != (undefined1  [8])0x0) &&
       (operator_delete((void *)auVar16), local_78 != (undefined1  [8])0x0)) {
      operator_delete((void *)local_78);
    }
    local_94 = local_94 + 1;
    if (verbose) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Neighborhood ",0xd);
      poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_94);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," size ",6);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    current ",0xc);
      poVar8 = std::ostream::_M_insert<double>(local_d0);
      cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      this_00 = (Station *)(ulong)(uint)(int)cVar7;
      std::ostream::put((char)poVar8);
      std::ostream::flush();
    }
    pPVar11 = P;
    local_40 = (_List_node_base *)Plan::getEvaluation(P);
    if ((long)pPVar4 - (long)auVar6 == 0) {
      bVar12 = false;
      local_c4 = 0;
    }
    else {
      lVar18 = (long)pPVar4 - (long)auVar6 >> 4;
      local_48 = (Station *)(lVar18 - 1);
      local_38 = (Station *)(lVar18 + (ulong)(lVar18 == 0));
      pSVar19 = (Station *)0x0;
      bVar12 = false;
      local_c4 = 0;
      local_a0 = local_d0;
      do {
        lVar18 = (long)pSVar19 * 0x10;
        lVar14 = (long)*(int *)((_func_int ***)auVar6 + (long)pSVar19 * 2);
        p_Var13 = (P->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        if (lVar14 < 1) {
          if (*(int *)((_func_int ***)auVar6 + (long)pSVar19 * 2) != 0) {
            do {
              p_Var13 = p_Var13->_M_prev;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0);
          }
        }
        else {
          do {
            p_Var13 = p_Var13->_M_next;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        station = (Station *)p_Var13[1]._M_next;
        iVar2 = *(int *)((long)(_func_int ***)auVar6 + lVar18 + 4);
        iVar3 = *(int *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                             *)((long)auVar6 + 8))->_M_t)._M_impl.field_0x0 + lVar18);
        beamlet = *(int *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                               *)((long)auVar6 + 8))->_M_t)._M_impl.field_0x4 + lVar18);
        if (iVar3 < 0) {
          local_d0 = closeBeamlet((ApertureILS *)pPVar11,beamlet,-iVar3,iVar2,station,
                                  (double)local_40,P);
        }
        else {
          local_d0 = openBeamlet((ApertureILS *)pPVar11,beamlet,iVar2,station,(double)local_40,P);
        }
        iVar17 = (int)pSVar19;
        if (verbose) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"  aLS Neighbor ",0xf);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar17);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," over station ",0xe);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,station->angle);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," aperture ",10);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," beamlet ",9);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,beamlet);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," operator ",10);
          poVar8 = (ostream *)std::ostream::operator<<((ostream *)poVar8,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8," result ",8);
          poVar8 = std::ostream::_M_insert<double>(local_d0);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          std::ostream::put((char)poVar8);
          std::ostream::flush();
          if (1e-05 < local_a0 - local_d0) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"     improvement ",0x11);
            poVar8 = std::ostream::_M_insert<double>(local_d0);
            cVar7 = std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
            this_00 = (Station *)(ulong)(uint)(int)cVar7;
            std::ostream::put((char)poVar8);
            std::ostream::flush();
            local_c4 = 1;
            if (iVar1 == 0) goto LAB_0012bf04;
            local_a0 = local_d0;
            local_ac = iVar17;
          }
        }
        else {
          dVar5 = local_a0 - local_d0;
          uVar20 = SUB84(local_d0,0);
          uVar21 = (undefined4)((ulong)local_d0 >> 0x20);
          if (dVar5 <= 1e-05) {
            uVar20 = SUB84(local_a0,0);
            uVar21 = (undefined4)((ulong)local_a0 >> 0x20);
          }
          if (1e-05 < dVar5) {
            local_c4 = 1;
          }
          this_00 = (Station *)(ulong)local_c4;
          if (1e-05 < dVar5) {
            local_ac = iVar17;
          }
          if (1e-05 < dVar5 && iVar1 == 0) {
LAB_0012bf04:
            bVar12 = (bool)(bVar12 | local_48 == pSVar19);
            local_c4 = 1;
            local_ac = iVar17;
            goto LAB_0012c02c;
          }
          local_a0 = (double)CONCAT44(uVar21,uVar20);
        }
        this_00 = station;
        Station::undoLast_abi_cxx11_
                  ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                   local_78,station);
        pPVar11 = (Plan *)local_90._0_8_;
        while (pPVar11 != (Plan *)local_90) {
          pPVar4 = (Plan *)pPVar11->_vptr_Plan;
          operator_delete(pPVar11);
          pPVar11 = pPVar4;
        }
        local_80 = (_Base_ptr)0x0;
        if (local_78 == (undefined1  [8])local_78) {
          pp_Var9 = &local_80;
          local_90._0_8_ = (Plan *)local_90;
          local_90._8_8_ = (Plan *)local_90;
        }
        else {
          pPStack_70->_vptr_Plan = (_func_int **)local_90;
          *(Plan **)&(((Plan *)local_78)->angle2station)._M_t._M_impl = (Plan *)local_90;
          pp_Var9 = local_68;
          local_90._0_8_ = local_78;
          local_90._8_8_ = pPStack_70;
          local_80 = local_68[0];
        }
        *pp_Var9 = (_Base_ptr)0x0;
        if (local_80 != (_Base_ptr)0x0) {
          pPVar11 = P;
          local_d0 = Plan::incremental_eval
                               (P,station,
                                (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                                 *)local_90);
          this_00 = station;
        }
        bVar12 = (bool)(bVar12 | local_48 == pSVar19);
        cVar10 = clock();
        if ((((double)local_50 != 0.0) || (NAN((double)local_50))) &&
           ((double)local_50 <= (double)(cVar10 - (long)local_58) / 1000000.0)) {
          if (verbose) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"  aLS timed out ",0x10);
            cVar7 = std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
            this_00 = (Station *)(ulong)(uint)(int)cVar7;
            pPVar11 = (Plan *)std::ostream::put(-0x60);
            std::ostream::flush();
          }
          break;
        }
        pSVar19 = (Station *)((long)&pSVar19->_vptr_Station + 1);
      } while (pSVar19 != local_38);
      if ((~(byte)local_c4 & 1) == 0 && iVar1 != 0) {
        lVar18 = (long)local_ac * 0x10;
        lVar14 = (long)*(int *)((_func_int ***)auVar6 + (long)local_ac * 2);
        p_Var13 = (P->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
                  _M_impl._M_node.super__List_node_base._M_next;
        if (lVar14 < 1) {
          if (*(int *)((_func_int ***)auVar6 + (long)local_ac * 2) != 0) {
            do {
              p_Var13 = p_Var13->_M_prev;
              lVar14 = lVar14 + 1;
            } while (lVar14 != 0);
          }
        }
        else {
          do {
            p_Var13 = p_Var13->_M_next;
            lVar14 = lVar14 + -1;
          } while (lVar14 != 0);
        }
        iVar2 = *(int *)((long)(_func_int ***)auVar6 + lVar18 + 4);
        iVar3 = *(int *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                             *)((long)auVar6 + 8))->_M_t)._M_impl.field_0x0 + lVar18);
        beamlet_00 = *(uint *)(&(((map<int,_imrt::Station_*,_std::less<int>,_std::allocator<std::pair<const_int,_imrt::Station_*>_>_>
                                   *)((long)auVar6 + 8))->_M_t)._M_impl.field_0x4 + lVar18);
        this_00 = (Station *)(ulong)beamlet_00;
        if (iVar3 < 0) {
          closeBeamlet((ApertureILS *)pPVar11,beamlet_00,-iVar3,iVar2,(Station *)p_Var13[1]._M_next,
                       local_d0,P);
          local_d0 = local_a0;
        }
        else {
          openBeamlet((ApertureILS *)pPVar11,beamlet_00,iVar2,(Station *)p_Var13[1]._M_next,local_d0
                      ,P);
          local_d0 = local_a0;
        }
      }
      else {
        local_d0 = local_a0;
      }
    }
LAB_0012c02c:
    cVar10 = clock();
    if ((((double)local_50 != 0.0) || (NAN((double)local_50))) &&
       ((double)local_50 <= (double)(cVar10 - (long)local_58) / 1000000.0)) {
      if (verbose) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"  aLS timed out ",0x10);
        std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x60);
        std::ostream::put(-0x60);
        std::ostream::flush();
      }
      goto LAB_0012c0c3;
    }
    auVar16 = auVar6;
    if (local_c4 == 0) {
LAB_0012c0c3:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  aLS best: ",0xc);
      std::ostream::_M_insert<double>(local_d0);
      pcVar15 = ": [nolo] : ";
      if (bVar12) {
        pcVar15 = ": [lo] : ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar15,(ulong)(byte)~bVar12 * 2 + 9);
      cVar10 = clock();
      poVar8 = std::ostream::_M_insert<double>((double)local_50);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," :",2);
      poVar8 = std::ostream::_M_insert<double>((double)(cVar10 - (long)local_58) / 1000000.0);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      pPVar4 = (Plan *)local_90._0_8_;
      while (pPVar4 != (Plan *)local_90) {
        pPVar11 = (Plan *)pPVar4->_vptr_Plan;
        operator_delete(pPVar4);
        pPVar4 = pPVar11;
      }
      if (auVar6 != (undefined1  [8])0x0) {
        operator_delete((void *)auVar6);
      }
      return local_d0;
    }
  } while( true );
}

Assistant:

double ApertureILS::aLocalSearch(Plan& P, double max_time, bool verbose) {
  Station *s;
  std::clock_t time_end, time_begin;
  double used_time;
  double local_best_eval, aux_eval, current_eval;
  bool improvement=true, best_improvement=ls_type;
  vector < pair< pair<int, int>, pair<int, int>> > a_list;
  pair< pair<int, int>, pair<int, int>> tabu;
  pair< pair<int, int>, pair<int,int>> best_move;
  list<pair<int, double> > diff;
  int i,j, best_n, aperture, beamlet, sign;
  bool completed = false;
  best_n = -1;
  j=-1;
  local_best_eval = aux_eval= P.getEvaluation();
  if (verbose)
    cout << "Staring aperture local search..." << endl;
  
  time_begin=clock();
  
  while (improvement) {
    j++;
    a_list = getShuffledApertureNeighbors(P);
    //a_list = getOrderedApertureNeighbors(P);
    improvement = false;
    completed = false;
    
    if (verbose)
      cout << "Neighborhood "<<j<< " size "<< a_list.size() << "    current " << local_best_eval << endl;
    
    current_eval = P.getEvaluation();
    for (i = 0; i < a_list.size(); i++) {
      s = P.get_station(a_list[i].first.first);
      aperture = a_list[i].first.second;
      beamlet = a_list[i].second.second;
      sign = a_list[i].second.first;
            
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, current_eval, P); 
      } else {
        aux_eval = openBeamlet(beamlet, aperture, *s, current_eval, P);
      }

      if (verbose) {
          cout << "  aLS Neighbor " << i << " over station " << s->getAngle() << " aperture " << aperture << " beamlet " << beamlet << " operator " << sign << " result " << aux_eval << endl;
      }

      if ((local_best_eval - aux_eval) > 0.00001){
        local_best_eval = aux_eval;
        best_n = i;
        improvement = true;
        if (verbose)
          cout << "     improvement " << aux_eval << endl ;
        if (!best_improvement) { 
          if (i==(a_list.size()-1)) completed=true;
          i = a_list.size();
          break;
        }
      }

      diff = s->undoLast();
      if (diff.size() > 0)
        aux_eval = P.incremental_eval(*s, diff);
      
      if (i==(a_list.size()-1)) completed=true;
      
      time_end = clock();
      used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
      if (max_time!=0 && used_time >= max_time) {
        if (verbose)
          cout << "  aLS timed out " << endl;
        break;
      }
      
    }
    
    //Apply best neighbor
    if (improvement && best_improvement) {
      s = P.get_station(a_list[best_n].first.first);
      aperture = a_list[best_n].first.second;
      beamlet = a_list[best_n].second.second;
      sign = a_list[best_n].second.first;
      if (sign < 0) {
        aux_eval = closeBeamlet(beamlet, abs(sign), aperture, *s, aux_eval, P);
      } else{
        aux_eval = openBeamlet(beamlet, aperture, *s, aux_eval, P);
      }
    }
    
    time_end = clock();
    used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
    if (max_time!=0 && used_time >= max_time) {
      if (verbose)
        cout << "  aLS timed out " << endl;
      break;
    }
  }
  
  cout << "  aLS best: " << local_best_eval ;
  if (!completed) cout << ": [nolo] : ";
  else  cout << ": [lo] : ";
  time_end = clock();
  used_time = double(time_end- time_begin) / CLOCKS_PER_SEC;
  cout << max_time << " :" << used_time << endl;
  
  return(local_best_eval);
}